

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts3HashElem * sqlite3Fts3HashFindElem(Fts3Hash *pH,void *pKey,int nKey)

{
  uint uVar1;
  Fts3HashElem *pFVar2;
  code *pcVar3;
  
  if ((pH != (Fts3Hash *)0x0) && (pH->ht != (_fts3ht *)0x0)) {
    pcVar3 = fts3BinHash;
    if (pH->keyClass == '\x01') {
      pcVar3 = fts3StrHash;
    }
    uVar1 = (*pcVar3)(pKey,nKey);
    pFVar2 = fts3FindElementByHash(pH,pKey,nKey,pH->htsize - 1U & uVar1);
    return pFVar2;
  }
  return (Fts3HashElem *)0x0;
}

Assistant:

SQLITE_PRIVATE Fts3HashElem *sqlite3Fts3HashFindElem(
  const Fts3Hash *pH, 
  const void *pKey, 
  int nKey
){
  int h;                          /* A hash on key */
  int (*xHash)(const void*,int);  /* The hash function */

  if( pH==0 || pH->ht==0 ) return 0;
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  h = (*xHash)(pKey,nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  return fts3FindElementByHash(pH,pKey,nKey, h & (pH->htsize-1));
}